

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_circle_gradient(int center_x,int center_y,float radius,rf_color color1,rf_color color2)

{
  _Bool _Var1;
  ulong uVar2;
  float x;
  float y;
  float fVar3;
  float fVar4;
  undefined1 local_54;
  undefined1 local_40;
  
  _Var1 = rf_gfx_check_buffer_limit(0x6c);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  x = (float)center_x;
  y = (float)center_y;
  uVar2 = 0;
  local_54 = color2.g;
  local_40 = color2.a;
  while (uVar2 < 0x168) {
    rf_gfx_color4ub(color1.r,color1.g,color1.b,color1.a);
    rf_gfx_vertex2f(x,y);
    rf_gfx_color4ub(color2.r,local_54,color2.b,local_40);
    fVar3 = sinf((float)(long)uVar2 * 0.017453292);
    fVar4 = cosf((float)(long)uVar2 * 0.017453292);
    rf_gfx_vertex2f(fVar3 * radius + x,fVar4 * radius + y);
    rf_gfx_color4ub(color2.r,local_54,color2.b,local_40);
    uVar2 = uVar2 + 10;
    fVar3 = sinf((float)(long)uVar2 * 0.017453292);
    fVar4 = cosf((float)(long)uVar2 * 0.017453292);
    rf_gfx_vertex2f(fVar3 * radius + x,fVar4 * radius + y);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_gradient(int center_x, int center_y, float radius, rf_color color1, rf_color color2)
{
    if (rf_gfx_check_buffer_limit(3 * 36)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_color4ub(color1.r, color1.g, color1.b, color1.a);
        rf_gfx_vertex2f(center_x, center_y);
        rf_gfx_color4ub(color2.r, color2.g, color2.b, color2.a);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*i)*radius, center_y + cosf(RF_DEG2RAD*i)*radius);
        rf_gfx_color4ub(color2.r, color2.g, color2.b, color2.a);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*(i + 10))*radius, center_y + cosf(RF_DEG2RAD*(i + 10))*radius);
    }
    rf_gfx_end();
}